

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okiadpcm.c
# Opt level: O1

INT16 oki_adpcm_clock(oki_adpcm_state *adpcm,UINT8 nibble)

{
  INT16 IVar1;
  short sVar2;
  
  sVar2 = adpcm->signal + adpcm->diff_lookup[(int)(nibble & 0xf | (int)adpcm->step << 4)];
  adpcm->signal = sVar2;
  IVar1 = 0x7ff;
  if ((0x7ff < sVar2) || (IVar1 = -0x800, sVar2 < -0x800)) {
    adpcm->signal = IVar1;
  }
  sVar2 = (short)adpcm->index_shift[nibble & 7] + adpcm->step;
  adpcm->step = sVar2;
  IVar1 = 0x30;
  if (sVar2 < 0x31) {
    if (-1 < sVar2) goto LAB_0016550c;
    IVar1 = 0;
  }
  adpcm->step = IVar1;
LAB_0016550c:
  return adpcm->signal;
}

Assistant:

INT16 oki_adpcm_clock(oki_adpcm_state* adpcm, UINT8 nibble)
{
	// update the signal
	adpcm->signal += adpcm->diff_lookup[adpcm->step * 16 + (nibble & 15)];

	// clamp to the maximum
	if (adpcm->signal > 2047)
		adpcm->signal = 2047;
	else if (adpcm->signal < -2048)
		adpcm->signal = -2048;

	// adjust the step size and clamp
	adpcm->step += adpcm->index_shift[nibble & 7];
	if (adpcm->step > 48)
		adpcm->step = 48;
	else if (adpcm->step < 0)
		adpcm->step = 0;

	// return the signal
	return adpcm->signal;
}